

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  unsigned_long_long *this_00;
  _Hash_node_base _Var1;
  int iVar2;
  mapped_type *pmVar3;
  tuple<const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_> in_RDX;
  pointer *__ptr;
  DtFromPseudoRootDtConverter *this_01;
  __node_base *p_Var4;
  Up pseudoDt_1;
  _tPseudoDtSels selLocPseudoDtsPair;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  undefined1 local_a0 [32];
  _tPseudoDtSels local_80;
  
  if (*(int *)((pseudoDt->_loc)._lineNumber + 8) != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3c6,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt &)"
                 );
  }
  _pseudoDtSels<yactfr::internal::PseudoOptType>
            ((_tPseudoDtSels *)(local_a0 + 0x20),(DtFromPseudoRootDtConverter *)pseudoDt,
             (PseudoOptType *)
             in_RDX.
             super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
             .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl);
  p_Var4 = &local_80.second._M_h._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
      pmVar3 = std::__detail::
               _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_a0);
      *pmVar3 = 0;
      _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_b8,pseudoDt);
      local_a0._0_8_ =
           in_RDX.
           super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
           .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl;
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00);
      local_b0._12_4_ = 1;
      tryCloneAttrs((MapItem *)local_b0);
      std::
      make_unique<yactfr::OptionalWithBooleanSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)local_a0,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )(local_b0 + 0xc),(DataLocation *)local_b8,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 (local_a0 + 0x20));
      (this->_dt)._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
           (StructureType *)local_a0._0_8_;
      local_a0._0_8_ = (PseudoDst *)0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_b0);
      if ((_Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
           )local_b8 != (StructureType *)0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
      std::
      pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
      ::~pair((pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
               *)(local_a0 + 0x20));
      return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
              )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
                )this;
    }
    _Var1._M_nxt = p_Var4[1]._M_nxt;
    iVar2 = (*(code *)(_Var1._M_nxt)->_M_nxt[2]._M_nxt)(_Var1._M_nxt);
  } while ((iVar2 == 0) && ((~*(uint *)&_Var1._M_nxt[6]._M_nxt[1]._M_nxt & 0x126) == 0));
  this_01 = (DtFromPseudoRootDtConverter *)local_a0;
  std::__cxx11::string::string
            ((string *)this_01,"Selector type of optional type isn\'t a boolean type.",
             (allocator *)local_b8);
  _throwInvalDataLoc(this_01,(string *)local_a0,(TextLocation *)(_Var1._M_nxt + 1),
                     (DataLocation *)(local_a0 + 0x20),
                     (TextLocation *)
                     ((long)in_RDX.
                            super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
                            .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>.
                            _M_head_impl + 8));
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtSels(pseudoOptType);

    for (const auto pseudoSelDt : selLocPseudoDtsPair.second) {
        if (pseudoSelDt->kind() != PseudoDt::Kind::ScalarDtWrapper ||
                !static_cast<const PseudoScalarDtWrapper&>(*pseudoSelDt).dt().isFixedLengthBooleanType()) {
            this->_throwInvalDataLoc("Selector type of optional type isn't a boolean type.",
                                     pseudoSelDt->loc(), selLocPseudoDtsPair.first, pseudoDt.loc());
        }
    }

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    return OptionalWithBooleanSelectorType::create(1, std::move(containedDt),
                                                   std::move(selLocPseudoDtsPair.first),
                                                   tryCloneAttrs(pseudoOptType.attrs()));
}